

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any.hpp
# Opt level: O0

int nonstd::any_lite::any_cast<int>(any *operand)

{
  bad_any_cast *this;
  bad_any_cast local_20;
  int *local_18;
  int *result;
  any *operand_local;
  
  result = (int *)operand;
  local_18 = any_cast<int_const>(operand);
  if (local_18 == (int *)0x0) {
    this = (bad_any_cast *)__cxa_allocate_exception(8);
    local_20 = (bad_any_cast)0x0;
    bad_any_cast::bad_any_cast(&local_20);
    bad_any_cast::bad_any_cast(this,&local_20);
    __cxa_throw(this,&bad_any_cast::typeinfo,bad_any_cast::~bad_any_cast);
  }
  return *local_18;
}

Assistant:

any_nodiscard inline ValueType any_cast( any const & operand )
{
   const ValueType * result = any_cast< typename std11::add_const< typename std11::remove_reference<ValueType>::type >::type >( &operand );

#if any_CONFIG_NO_EXCEPTIONS
   assert( result );
#else
   if ( ! result )
   {
       throw bad_any_cast();
   }
#endif

   return *result;
}